

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall QListModel::move(QListModel *this,int srcRow,int dstRow)

{
  ulong uVar1;
  char cVar2;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < srcRow && srcRow != dstRow) {
    uVar1 = (this->items).d.size;
    if (((uint)dstRow <= uVar1 && -1 < dstRow) && (uint)srcRow < uVar1) {
      local_40 = 0xffffffffffffffff;
      local_38 = 0;
      uStack_30 = 0;
      local_58 = 0xffffffffffffffff;
      local_50 = 0;
      uStack_48 = 0;
      cVar2 = QAbstractItemModel::beginMoveRows
                        ((QModelIndex *)this,(int)&local_40,srcRow,
                         (QModelIndex *)(ulong)(uint)srcRow,(int)&local_58);
      if (cVar2 != '\0') {
        QList<QListWidgetItem_*>::move
                  (&this->items,(ulong)(uint)srcRow,
                   (ulong)(dstRow - (uint)((uint)srcRow < (uint)dstRow)));
        QAbstractItemModel::endMoveRows();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::move(int srcRow, int dstRow)
{
    if (srcRow == dstRow
        || srcRow < 0 || srcRow >= items.size()
        || dstRow < 0 || dstRow > items.size())
        return;

    if (!beginMoveRows(QModelIndex(), srcRow, srcRow, QModelIndex(), dstRow))
        return;
    if (srcRow < dstRow)
        --dstRow;
    items.move(srcRow, dstRow);
    endMoveRows();
}